

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itersolv.c
# Opt level: O3

Vector * CGIter(QMatrix *A,Vector *x,Vector *b,int MaxIter,PrecondProcType PrecondProc,
               double OmegaPrecond)

{
  bool bVar1;
  Boolean BVar2;
  LASErrIdType LVar3;
  size_t Dim;
  Vector *pVVar4;
  int iVar5;
  double bNorm;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Vector r;
  Vector q;
  Vector p;
  Vector z;
  Vector local_f0;
  Vector local_c0;
  Vector local_90;
  Vector local_60;
  
  Q_Lock(A);
  V_Lock(x);
  V_Lock(b);
  Dim = Q_GetDim(A);
  V_Constr(&local_f0,"r",Dim,Normal,True);
  V_Constr(&local_90,"p",Dim,Normal,True);
  V_Constr(&local_c0,"q",Dim,Normal,True);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Constr(&local_60,"z",Dim,Normal,True);
  }
  LVar3 = LASResult();
  if (LVar3 == LASOK) {
    bNorm = l2Norm_V(b);
    dVar6 = l1Norm_V(x);
    auVar8._8_4_ = (int)(Dim >> 0x20);
    auVar8._0_8_ = Dim;
    auVar8._12_4_ = 0x45300000;
    pVVar4 = b;
    if (2.2250738585072014e-307 <=
        ABS(dVar6 / ((auVar8._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)Dim) - 4503599627370496.0)))) {
      BVar2 = Q_KerDefined(A);
      if (BVar2 != False) {
        OrthoRightKer_VQ(x,A);
      }
      pVVar4 = Mul_QV(A,x);
      pVVar4 = Sub_VV(b,pVVar4);
    }
    Asgn_VV(&local_f0,pVVar4);
    if ((PrecondProc == (PrecondProcType)0x0) && (BVar2 = Q_KerDefined(A), BVar2 == False)) {
      dVar6 = l2Norm_V(&local_f0);
      BVar2 = RTCResult(0,dVar6,bNorm,CGIterId);
      if (0 < MaxIter && BVar2 == False) {
        dVar6 = 0.0;
        iVar5 = 1;
        do {
          dVar7 = l2Norm_V(&local_f0);
          dVar7 = dVar7 * dVar7;
          pVVar4 = &local_f0;
          if (iVar5 != 1) {
            pVVar4 = Mul_SV(dVar7 / dVar6,&local_90);
            pVVar4 = Add_VV(&local_f0,pVVar4);
          }
          Asgn_VV(&local_90,pVVar4);
          pVVar4 = Mul_QV(A,&local_90);
          Asgn_VV(&local_c0,pVVar4);
          dVar6 = Mul_VV(&local_90,&local_c0);
          pVVar4 = Mul_SV(dVar7 / dVar6,&local_90);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_SV(dVar7 / dVar6,&local_c0);
          SubAsgn_VV(&local_f0,pVVar4);
          dVar6 = l2Norm_V(&local_f0);
          BVar2 = RTCResult(iVar5,dVar6,bNorm,CGIterId);
        } while ((BVar2 == False) &&
                (bVar1 = iVar5 < MaxIter, dVar6 = dVar7, iVar5 = iVar5 + 1, bVar1));
      }
    }
    else {
      dVar6 = l2Norm_V(&local_f0);
      BVar2 = RTCResult(0,dVar6,bNorm,CGIterId);
      if (0 < MaxIter && BVar2 == False) {
        dVar6 = 0.0;
        iVar5 = 1;
        do {
          if (PrecondProc == (PrecondProcType)0x0) {
            Asgn_VV(&local_60,&local_f0);
          }
          else {
            (*PrecondProc)(A,&local_60,&local_f0,OmegaPrecond);
          }
          BVar2 = Q_KerDefined(A);
          if (BVar2 != False) {
            OrthoRightKer_VQ(&local_60,A);
          }
          dVar7 = Mul_VV(&local_f0,&local_60);
          pVVar4 = &local_60;
          if (iVar5 != 1) {
            pVVar4 = Mul_SV(dVar7 / dVar6,&local_90);
            pVVar4 = Add_VV(&local_60,pVVar4);
          }
          Asgn_VV(&local_90,pVVar4);
          pVVar4 = Mul_QV(A,&local_90);
          Asgn_VV(&local_c0,pVVar4);
          dVar6 = Mul_VV(&local_90,&local_c0);
          pVVar4 = Mul_SV(dVar7 / dVar6,&local_90);
          AddAsgn_VV(x,pVVar4);
          pVVar4 = Mul_SV(dVar7 / dVar6,&local_c0);
          SubAsgn_VV(&local_f0,pVVar4);
          dVar6 = l2Norm_V(&local_f0);
          BVar2 = RTCResult(iVar5,dVar6,bNorm,CGIterId);
        } while ((BVar2 == False) &&
                (bVar1 = iVar5 < MaxIter, dVar6 = dVar7, iVar5 = iVar5 + 1, bVar1));
      }
    }
    BVar2 = Q_KerDefined(A);
    if (BVar2 != False) {
      OrthoRightKer_VQ(x,A);
    }
  }
  V_Destr(&local_f0);
  V_Destr(&local_90);
  V_Destr(&local_c0);
  if ((PrecondProc != (PrecondProcType)0x0) || (BVar2 = Q_KerDefined(A), BVar2 != False)) {
    V_Destr(&local_60);
  }
  Q_Unlock(A);
  V_Unlock(x);
  V_Unlock(b);
  return x;
}

Assistant:

Vector *CGIter(QMatrix *A, Vector *x, Vector *b, int MaxIter,
            PrecondProcType PrecondProc, double OmegaPrecond)
{
    /*
     *  for details to the algorithm see
     *
     *  R. Barrett, M. Berry, T. F. Chan, J. Demmel, J. Donato, J. Dongarra,
     *  V. Eijkhout, R. Pozo, Ch. Romine, H. van der Vorst:
     *  Templates for the Solution of Linear Systems: Building Blocks
     *  for Iterative Solvers;
     *  SIAM, Philadelphia, 1994
     *
     */

    int Iter;
    double Alpha, Beta, Rho, RhoOld = 0.0;
    double bNorm;
    size_t Dim;
    Vector r, p, q, z;

    Q_Lock(A);
    V_Lock(x);
    V_Lock(b);
    
    Dim = Q_GetDim(A);
    V_Constr(&r, "r", Dim, Normal, True);
    V_Constr(&p, "p", Dim, Normal, True);
    V_Constr(&q, "q", Dim, Normal, True);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Constr(&z, "z", Dim, Normal, True);

    if (LASResult() == LASOK) {
        bNorm = l2Norm_V(b);
        
        Iter = 0;
        /* r = b - A * x(i) */
        if (!IsZero(l1Norm_V(x) / Dim)) {
            if (Q_KerDefined(A))
	       OrthoRightKer_VQ(x, A);
            Asgn_VV(&r, Sub_VV(b, Mul_QV(A, x)));
        } else {
            Asgn_VV(&r, b);
	}
        if (PrecondProc != NULL || Q_KerDefined(A)) {
            /* preconditioned CG */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
		if (PrecondProc != NULL)
                    (*PrecondProc)(A, &z, &r, OmegaPrecond);
		else
		    Asgn_VV(&z, &r);
		if (Q_KerDefined(A))
		   OrthoRightKer_VQ(&z, A);
                Rho = Mul_VV(&r, &z);
                if (Iter == 1) {
                    Asgn_VV(&p, &z);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&z, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        } else {
            /* plain CG (z = r) */
            while (!RTCResult(Iter, l2Norm_V(&r), bNorm, CGIterId)
                && Iter < MaxIter) {
                Iter++;
                Rho = pow(l2Norm_V(&r), 2.0);
                if (Iter == 1) {
                    Asgn_VV(&p, &r);
                } else {
                    Beta = Rho / RhoOld;
                    Asgn_VV(&p, Add_VV(&r, Mul_SV(Beta, &p)));
                }
                Asgn_VV(&q, Mul_QV(A, &p));
                Alpha = Rho / Mul_VV(&p, &q);
                AddAsgn_VV(x, Mul_SV(Alpha, &p));
                SubAsgn_VV(&r, Mul_SV(Alpha, &q));
                RhoOld = Rho;
            }
        }
        if (Q_KerDefined(A))
	   OrthoRightKer_VQ(x, A);
    }
    
    V_Destr(&r);
    V_Destr(&p);
    V_Destr(&q);
    if (PrecondProc != NULL || Q_KerDefined(A))
        V_Destr(&z);

    Q_Unlock(A);
    V_Unlock(x);
    V_Unlock(b);

    return(x);
}